

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::GetOwnPropertySymbolsInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  Var instance;
  RecyclableObject *value;
  JavascriptArray *instance_00;
  undefined4 *puVar4;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == GetOwnPropertySymbolsInfoActionTag) {
    instance = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (instance != (Var)0x0) {
      BVar3 = Js::JavascriptOperators::IsObject(instance);
      if (BVar3 != 0) {
        value = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,value,false);
        }
        instance_00 = Js::JavascriptOperators::GetOwnPropertySymbols(instance,scriptContext);
        if (instance_00 != (JavascriptArray *)0x0) {
          BVar3 = Js::CrossSite::NeedMarshalVar(instance_00,scriptContext);
          if (BVar3 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                               ,0x28d,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))"
                               ,"res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar4 = 0;
          }
        }
        JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)55>
                  (executeContext,evt,instance_00);
        return;
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void GetOwnPropertySymbolsInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetOwnPropertySymbolsInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::JavascriptArray* res = Js::JavascriptOperators::GetOwnPropertySymbols(var, ctx);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetOwnPropertySymbolsInfoActionTag>(executeContext, evt, res);
        }